

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O1

optional<long> SettingToInt(SettingsValue *value)

{
  VType VVar1;
  long lVar2;
  int iVar3;
  _Storage<long,_true> _Var4;
  string *psVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long in_FS_OFFSET;
  string_view str;
  optional<long> oVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  VVar1 = value->typ;
  _Var4._M_value._4_4_ = 0;
  _Var4._M_value._0_4_ = VVar1;
  if (VVar1 == VNULL) {
    uVar6 = 0;
  }
  else {
    if (VVar1 == VBOOL) {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&value->val,"1");
      if (iVar3 != 0) {
        uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
        _Var4._M_value = 0;
        goto LAB_00d61031;
      }
    }
    if (value->typ == VBOOL) {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&value->val,"1");
      if (iVar3 == 0) {
        uVar6 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
        _Var4._M_value = 1;
        goto LAB_00d61031;
      }
    }
    if (value->typ == VNUM) {
      _Var4._M_value = UniValue::getInt<long>(value);
      uVar6 = extraout_RDX_01;
    }
    else {
      psVar5 = UniValue::get_str_abi_cxx11_(value);
      str._M_str = (psVar5->_M_dataplus)._M_p;
      str._M_len = psVar5->_M_string_length;
      _Var4._M_value = LocaleIndependentAtoi<long>(str);
      uVar6 = extraout_RDX_02;
    }
    uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
  }
LAB_00d61031:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar6;
    oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var4._M_value;
    return (optional<long>)
           oVar7.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

bool isFalse() const { return (typ == VBOOL) && (val != "1"); }